

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O0

int Compute_file_md5(char *file_path,char *md5_str)

{
  byte bVar1;
  bool bVar2;
  uint inputlen;
  long *plVar3;
  long local_6a0;
  fstream file;
  undefined1 local_490 [8];
  MD5_CTX md5;
  uchar md5_value [16];
  uchar data [1024];
  int i;
  char *md5_str_local;
  char *file_path_local;
  
  std::fstream::fstream(&local_6a0,file_path,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_6a0 + *(long *)(local_6a0 + -0x18)));
  if ((bVar1 & 1) == 0) {
    MD5Init((MD5_CTX *)local_490);
    while( true ) {
      plVar3 = (long *)std::istream::get((char *)&local_6a0,(long)(md5_value + 8));
      bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
      if (!bVar2) break;
      inputlen = std::istream::gcount();
      MD5Update((MD5_CTX *)local_490,md5_value + 8,inputlen);
    }
    std::fstream::close();
    MD5Final((MD5_CTX *)local_490,md5.buffer + 0x38);
    data[0x3fc] = '\0';
    data[0x3fd] = '\0';
    data[0x3fe] = '\0';
    data[0x3ff] = '\0';
    for (; (int)data._1020_4_ < 0x10; data._1020_4_ = data._1020_4_ + 1) {
      snprintf(md5_str + (int)(data._1020_4_ << 1),3,"%02x",
               (ulong)md5.buffer[(long)(int)data._1020_4_ + 0x38]);
    }
    file_path_local._4_4_ = 0;
  }
  else {
    perror("open");
    file_path_local._4_4_ = -1;
  }
  std::fstream::~fstream(&local_6a0);
  return file_path_local._4_4_;
}

Assistant:

int Compute_file_md5(const char *file_path, char *md5_str)
{
    int i;
    unsigned char data[READ_DATA_SIZE];
    unsigned char md5_value[MD5_SIZE];
    MD5_CTX md5;

    std::fstream file(file_path, std::ios::in);
    if (!file)
    {
        perror("open");
        return -1;
    }

    // init md5
    MD5Init(&md5);

    while (file.get((char*)data, READ_DATA_SIZE)) {
        MD5Update(&md5, data, (unsigned int)file.gcount());
    }

    file.close();

    MD5Final(&md5, md5_value);

    // convert md5 value to md5 string
    for(i = 0; i < MD5_SIZE; i++) {
        snprintf(md5_str + i*2, 2+1, "%02x", md5_value[i]);
    }

    return 0;
}